

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenstream.cpp
# Opt level: O1

bool __thiscall embree::TokenStream::trySymbols(TokenStream *this,Token *token,ParseLocation *loc)

{
  string *symbol;
  pointer pbVar1;
  pointer pcVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  element_type *peVar3;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  bool bVar5;
  ulong uVar6;
  long lVar7;
  bool bVar8;
  string local_98;
  undefined1 local_78 [8];
  _Alloc_hider local_70;
  char local_60 [16];
  element_type *local_50;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_48;
  ssize_t local_40;
  ssize_t sStack_38;
  
  symbol = (this->symbols).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  bVar8 = (this->symbols).
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish != symbol;
  if (bVar8) {
    bVar5 = trySymbol(this,symbol);
    if (bVar5) {
      uVar6 = 0;
    }
    else {
      lVar7 = 0x20;
      uVar6 = 0;
      do {
        uVar6 = uVar6 + 1;
        pbVar1 = (this->symbols).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        bVar8 = uVar6 < (ulong)((long)(this->symbols).
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5
                               );
        if (!bVar8) {
          return bVar8;
        }
        bVar5 = trySymbol(this,(string *)((long)&(pbVar1->_M_dataplus)._M_p + lVar7));
        lVar7 = lVar7 + 0x20;
      } while (!bVar5);
    }
    pbVar1 = (this->symbols).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pcVar2 = pbVar1[uVar6]._M_dataplus._M_p;
    local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_98,pcVar2,pcVar2 + pbVar1[uVar6]._M_string_length);
    Token::Token((Token *)local_78,&local_98,TY_SYMBOL,loc);
    token->ty = local_78._0_4_;
    token->field_1 = (anon_union_4_3_4e90a026_for_Token_2)local_78._4_4_;
    std::__cxx11::string::operator=((string *)&token->str,(string *)&local_70);
    _Var4._M_pi = _Stack_48._M_pi;
    peVar3 = local_50;
    local_50 = (element_type *)0x0;
    _Stack_48._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    this_00 = (token->loc).fileName.
              super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi;
    (token->loc).fileName.
    super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = peVar3;
    (token->loc).fileName.
    super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = _Var4._M_pi;
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    }
    (token->loc).lineNumber = local_40;
    (token->loc).colNumber = sStack_38;
    if (_Stack_48._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_48._M_pi);
    }
    if (local_70._M_p != local_60) {
      operator_delete(local_70._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      operator_delete(local_98._M_dataplus._M_p);
    }
  }
  return bVar8;
}

Assistant:

bool TokenStream::trySymbols(Token& token, const ParseLocation& loc)
  {
    for (size_t i=0; i<symbols.size(); i++) {
      if (!trySymbol(symbols[i])) continue;
      token = Token(symbols[i],Token::TY_SYMBOL,loc);
      return true;
    }
    return false;
  }